

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GenericDatum.hh
# Opt level: O0

GenericArray * __thiscall avro::GenericArray::operator=(GenericArray *this,GenericArray *param_2)

{
  GenericContainer *in_RSI;
  GenericArray *in_RDI;
  vector<avro::GenericDatum,_std::allocator<avro::GenericDatum>_> *in_stack_00000088;
  vector<avro::GenericDatum,_std::allocator<avro::GenericDatum>_> *in_stack_00000090;
  
  GenericContainer::operator=(in_RSI,&in_RDI->super_GenericContainer);
  std::vector<avro::GenericDatum,_std::allocator<avro::GenericDatum>_>::operator=
            (in_stack_00000090,in_stack_00000088);
  return in_RDI;
}

Assistant:

class AVRO_DECL GenericArray : public GenericContainer {
public:
    /**
     * The contents type for the array.
     */
    typedef std::vector<GenericDatum> Value;

    /**
     * Constructs a generic array corresponding to the given schema \p schema,
     * which should be of Avro type array.
     */
    GenericArray(const NodePtr& schema) : GenericContainer(AVRO_ARRAY, schema) {
    }

    /**
     * Returns the contents of this array.
     */
    const Value& value() const {
        return value_;
    }

    /**
     * Returns the reference to the contents of this array.
     */
    Value& value() {
        return value_;
    }
private:
    Value value_;
}